

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O3

int __thiscall
chrono::geometry::ChTriangleMeshConnected::RepairDuplicateVertexes
          (ChTriangleMeshConnected *this,double tolerance)

{
  pointer pCVar1;
  double dVar2;
  pointer pCVar3;
  int *piVar4;
  pointer pCVar5;
  pointer pCVar6;
  int iVar7;
  pointer pCVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> processed_verts;
  vector<int,_std::allocator<int>_> new_indexes;
  allocator_type local_69;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_68;
  double local_48;
  vector<int,_std::allocator<int>_> local_40;
  
  local_68.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48 = tolerance;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_40,
             ((long)(this->m_vertices).
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_vertices).
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,&local_69)
  ;
  pCVar5 = (this->m_vertices).
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pCVar8 = (this->m_vertices).
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pCVar8 == pCVar5) {
    iVar7 = 0;
  }
  else {
    pCVar3 = (pointer)0x0;
    pCVar6 = (pointer)0x0;
    uVar13 = 0;
    iVar7 = 0;
    dVar17 = local_48;
    do {
      if ((long)pCVar6 - (long)pCVar3 != 0) {
        pdVar12 = pCVar3->m_data + 2;
        lVar9 = ((long)pCVar6 - (long)pCVar3 >> 3) * -0x5555555555555555;
        lVar11 = 0;
        do {
          dVar2 = pCVar5[uVar13].m_data[1] - pdVar12[-1];
          auVar14._8_8_ = 0;
          auVar14._0_8_ = pCVar5[uVar13].m_data[0] - ((ChVector<double> *)(pdVar12 + -2))->m_data[0]
          ;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = dVar2 * dVar2;
          auVar14 = vfmadd231sd_fma(auVar15,auVar14,auVar14);
          auVar16._8_8_ = 0;
          auVar16._0_8_ = pCVar5[uVar13].m_data[2] - *pdVar12;
          auVar14 = vfmadd231sd_fma(auVar14,auVar16,auVar16);
          if (auVar14._0_8_ < dVar17) {
            iVar7 = iVar7 + 1;
            local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar13] = (int)lVar11;
            goto LAB_008098d1;
          }
          lVar11 = lVar11 + 1;
          pdVar12 = pdVar12 + 3;
        } while (lVar9 + (ulong)(lVar9 == 0) != lVar11);
      }
      std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
                (&local_68,pCVar5 + uVar13);
      local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar13] =
           (int)((ulong)((long)local_68.
                               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_68.
                              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 + -1;
      pCVar5 = (this->m_vertices).
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar8 = (this->m_vertices).
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pCVar3 = local_68.
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar6 = local_68.
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      dVar17 = local_48;
LAB_008098d1:
      uVar13 = uVar13 + 1;
      uVar10 = ((long)pCVar8 - (long)pCVar5 >> 3) * -0x5555555555555555;
    } while (uVar13 <= uVar10 && uVar10 - uVar13 != 0);
  }
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::operator=
            (&this->m_vertices,&local_68);
  pCVar1 = (this->m_face_v_indices).
           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(this->m_face_v_indices).
                super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pCVar1;
  if (lVar9 == 0) {
    if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0) goto LAB_0080995c;
  }
  else {
    lVar9 = (lVar9 >> 2) * -0x5555555555555555;
    lVar9 = lVar9 + (ulong)(lVar9 == 0);
    piVar4 = pCVar1->m_data + 2;
    do {
      ((ChVector<int> *)(piVar4 + -2))->m_data[0] =
           local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[((ChVector<int> *)(piVar4 + -2))->m_data[0]];
      piVar4[-1] = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[piVar4[-1]];
      *piVar4 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[*piVar4];
      piVar4 = piVar4 + 3;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
LAB_0080995c:
  if (local_68.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar7;
}

Assistant:

int ChTriangleMeshConnected::RepairDuplicateVertexes(const double tolerance) {
    int nmerged = 0;
    std::vector<ChVector<>> processed_verts;
    std::vector<int> new_indexes(m_vertices.size());

    // merge vertexes
    for (int i = 0; i < m_vertices.size(); ++i) {
        bool tomerge = false;
        for (int j = 0; j < processed_verts.size(); ++j) {
            if ((m_vertices[i] - processed_verts[j]).Length2() < tolerance) {
                tomerge = true;
                ++nmerged;
                new_indexes[i] = j;
                break;
            }
        }
        if (!tomerge) {
            processed_verts.push_back(m_vertices[i]);
            new_indexes[i] = (int)processed_verts.size() - 1;
        }
    }

    m_vertices = processed_verts;

    // Update the merged vertexes also in face indexes to vertexes
    // Note: we DO NOT update the normal, color, UV, or material indices!
    for (int i = 0; i < this->m_face_v_indices.size(); ++i) {
        m_face_v_indices[i].x() = new_indexes[m_face_v_indices[i].x()];
        m_face_v_indices[i].y() = new_indexes[m_face_v_indices[i].y()];
        m_face_v_indices[i].z() = new_indexes[m_face_v_indices[i].z()];
    }

    return nmerged;
}